

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O1

void on_underlying_io_close_sent(void *context,IO_SEND_RESULT io_send_result)

{
  int iVar1;
  undefined8 in_RAX;
  undefined4 uVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  uVar2 = (undefined4)((ulong)in_RAX >> 0x20);
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
               ,"on_underlying_io_close_sent",0x39e,1,"NULL context in ");
    return;
  }
  if (io_send_result != IO_SEND_OK) {
    if (io_send_result == IO_SEND_ERROR) {
      return;
    }
    if (io_send_result != IO_SEND_CANCELLED) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                 ,"on_underlying_io_close_sent",0x3a7,1,"Unknown enum value: %d",
                 CONCAT44(uVar2,io_send_result));
      return;
    }
  }
  if (*(int *)((long)context + 0x40) == 5) {
    *(undefined4 *)((long)context + 0x40) = 6;
    iVar1 = xio_close(*(XIO_HANDLE *)((long)context + 8),on_underlying_io_close_complete,context);
    if (iVar1 != 0) {
      *(undefined4 *)((long)context + 0x40) = 0;
      if (*(code **)((long)context + 0x88) != (code *)0x0) {
        (**(code **)((long)context + 0x88))(*(undefined8 *)((long)context + 0x90));
        return;
      }
    }
  }
  return;
}

Assistant:

static void on_underlying_io_close_sent(void* context, IO_SEND_RESULT io_send_result)
{
    if (context == NULL)
    {
        /* Codes_SRS_UWS_CLIENT_01_489: [ When on_underlying_io_close_sent is called with NULL context, it shall do nothing. ] */
        LogError("NULL context in ");
    }
    else
    {
        UWS_CLIENT_INSTANCE* uws_client = (UWS_CLIENT_HANDLE)context;

        switch (io_send_result)
        {
        default:
            LogError("Unknown enum value: %d", io_send_result);
            break;

        case IO_SEND_OK:
        case IO_SEND_CANCELLED:
            if (uws_client->uws_state == UWS_STATE_CLOSING_SENDING_CLOSE)
            {
                uws_client->uws_state = UWS_STATE_CLOSING_UNDERLYING_IO;

                /* Codes_SRS_UWS_CLIENT_01_490: [ When on_underlying_io_close_sent is called while the uws client is CLOSING, on_underlying_io_close_sent shall close the underlying IO by calling xio_close. ]*/
                if (xio_close(uws_client->underlying_io, on_underlying_io_close_complete, uws_client) != 0)
                {
                    /* Codes_SRS_UWS_CLIENT_01_496: [ If the close was initiated by the peer no on_ws_close_complete shall be called. ]*/
                    indicate_ws_close_complete(uws_client);
                }
            }

        case IO_SEND_ERROR:
            break;
        }
    }
}